

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

Am_Connection * Am_Connection::Open(sockaddr *sa)

{
  uint uVar1;
  int iVar2;
  Am_Connection *pAVar3;
  Am_Connection_Data *this;
  Connection_List_Ptr pcVar4;
  
  pAVar3 = (Am_Connection *)operator_new(8);
  Am_Connection(pAVar3);
  this = (Am_Connection_Data *)operator_new(0x48);
  Am_Connection_Data::Am_Connection_Data(this);
  pAVar3->data = this;
  pcVar4 = (Connection_List_Ptr)operator_new(0x10);
  pcVar4->connection_ptr = pAVar3;
  pcVar4->next = connection_list;
  num_sockets = num_sockets + 1;
  connection_list = pcVar4;
  uVar1 = socket(2,1,0);
  if ((int)uVar1 < 0) {
    perror("socket");
    pAVar3->data = (Am_Connection_Data *)0x0;
  }
  else {
    *(uint *)&(pAVar3->data->super_Am_Wrapper).field_0xc = uVar1;
    socket_flags->fds_bits[uVar1 >> 6] =
         socket_flags->fds_bits[uVar1 >> 6] | 1L << ((byte)uVar1 & 0x3f);
    iVar2 = connect(*(int *)&(pAVar3->data->super_Am_Wrapper).field_0xc,(sockaddr *)sa,0x10);
    if (iVar2 < 0) {
      Delete_Connection(pAVar3);
      pAVar3 = Open();
      return pAVar3;
    }
    if (pAVar3->data != (Am_Connection_Data *)0x0) {
      pAVar3->data->connected = true;
    }
  }
  return pAVar3;
}

Assistant:

Am_Connection *
Am_Connection::Open(struct sockaddr *sa)
{
  /*
   * Variable initialization
   */
  Am_Connection *p_connection;
  p_connection = new Am_Connection;
  p_connection->data = new Am_Connection_Data;

  Add_Connection(p_connection);

  /* Allocate an open socket */
  int temp_socket;

  if ((temp_socket = socket(PF_INET, SOCK_STREAM, 0)) < 0) {
    perror("socket");
    p_connection->Set_Valid_Flag(false);
  } else {
    p_connection->Set_Socket(temp_socket);
    /* Attempt to Connect to the remote server */
    if ((connect(p_connection->Get_Socket(), sa, sizeof(struct sockaddr))) >=
        0) {
      p_connection->Set_Connect_Flag(true);
    } else /* Go into passive mode */
    {
      //perror("connect");
      Delete_Connection(p_connection);
      p_connection = Open();
    }
  }
  return p_connection;
}